

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TProtocol.h
# Opt level: O3

uint32_t duckdb_apache::thrift::protocol::
         skip<duckdb_apache::thrift::protocol::TCompactProtocolT<duckdb::ThriftFileTransport>>
                   (TCompactProtocolT<duckdb::ThriftFileTransport> *prot,TType type)

{
  uint32_t *puVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  _Elt_pointer psVar5;
  TException *this;
  TType TVar6;
  uint uVar7;
  uint32_t size;
  uint32_t size_2;
  bool boolv;
  TType local_58;
  uint local_54;
  undefined1 local_50 [32];
  
  TProtocol::incrementInputRecursionDepth((TProtocol *)prot);
  switch(type) {
  case T_BOOL:
    uVar2 = TCompactProtocolT<duckdb::ThriftFileTransport>::readBool(prot,(bool *)local_50);
    break;
  case T_BYTE:
    uVar2 = 1;
    transport::readAll<duckdb::ThriftFileTransport>
              ((transport *)prot->trans_,(ThriftFileTransport *)local_50,&DAT_00000001,
               (&switchD_0107a4e0::switchdataD_0139c050)[type - T_BOOL] + 0x139c050);
    break;
  case T_DOUBLE:
    uVar2 = 8;
    transport::readAll<duckdb::ThriftFileTransport>
              ((transport *)prot->trans_,(ThriftFileTransport *)local_50,(uint8_t *)0x8,
               (&switchD_0107a4e0::switchdataD_0139c050)[type - T_BOOL] + 0x139c050);
    break;
  default:
    this = (TException *)__cxa_allocate_exception(0x30);
    local_50._0_8_ = local_50 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"invalid TType","");
    TException::TException(this,(string *)local_50);
    *(undefined ***)this = &PTR__TException_019a5480;
    *(undefined4 *)(this + 1) = 1;
    __cxa_throw(this,&TProtocolException::typeinfo,TException::~TException);
  case T_I16:
    uVar2 = TCompactProtocolT<duckdb::ThriftFileTransport>::readVarint64(prot,(int64_t *)local_50);
    break;
  case T_I32:
    uVar2 = TCompactProtocolT<duckdb::ThriftFileTransport>::readVarint64(prot,(int64_t *)local_50);
    break;
  case T_I64:
    uVar2 = TCompactProtocolT<duckdb::ThriftFileTransport>::readVarint64(prot,(int64_t *)local_50);
    break;
  case T_STRING:
    local_50._8_8_ = (CachingFileHandle *)0x0;
    local_50[0x10] = '\0';
    local_50._0_8_ = local_50 + 0x10;
    uVar2 = TCompactProtocolT<duckdb::ThriftFileTransport>::readBinary(prot,(string *)local_50);
    if ((undefined1 *)local_50._0_8_ == local_50 + 0x10) break;
    goto LAB_0107a6b9;
  case T_STRUCT:
    local_50._0_8_ = local_50 + 0x10;
    local_50._8_8_ = (CachingFileHandle *)0x0;
    local_50[0x10] = '\0';
    uVar3 = TCompactProtocolT<duckdb::ThriftFileTransport>::readStructBegin(prot,(string *)local_50)
    ;
    while( true ) {
      uVar2 = TCompactProtocolT<duckdb::ThriftFileTransport>::readFieldBegin
                        (prot,(string *)local_50,&local_58,(int16_t *)&local_54);
      uVar2 = uVar2 + uVar3;
      if (local_58 == T_STOP) break;
      uVar3 = skip<duckdb_apache::thrift::protocol::TCompactProtocolT<duckdb::ThriftFileTransport>>
                        (prot,local_58);
      uVar3 = uVar3 + uVar2;
    }
    psVar5 = (prot->lastField_).c.super__Deque_base<short,_std::allocator<short>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    if (psVar5 == (prot->lastField_).c.super__Deque_base<short,_std::allocator<short>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_first) {
      psVar5 = (prot->lastField_).c.super__Deque_base<short,_std::allocator<short>_>._M_impl.
               super__Deque_impl_data._M_finish._M_node[-1] + 0x100;
    }
    prot->lastFieldId_ = psVar5[-1];
    std::deque<short,_std::allocator<short>_>::pop_back(&(prot->lastField_).c);
    if ((undefined1 *)local_50._0_8_ == local_50 + 0x10) break;
LAB_0107a6b9:
    operator_delete((void *)local_50._0_8_);
    break;
  case T_MAP:
    uVar2 = TCompactProtocolT<duckdb::ThriftFileTransport>::readMapBegin
                      (prot,(TType *)local_50,&local_58,&local_54);
    if (local_54 != 0) {
      uVar7 = 0;
      do {
        uVar3 = skip<duckdb_apache::thrift::protocol::TCompactProtocolT<duckdb::ThriftFileTransport>>
                          (prot,local_50._0_4_);
        uVar4 = skip<duckdb_apache::thrift::protocol::TCompactProtocolT<duckdb::ThriftFileTransport>>
                          (prot,local_58);
        uVar2 = uVar2 + uVar3 + uVar4;
        uVar7 = uVar7 + 1;
      } while (uVar7 < local_54);
    }
    break;
  case T_SET:
    uVar2 = TCompactProtocolT<duckdb::ThriftFileTransport>::readListBegin
                      (prot,(TType *)local_50,&local_58);
    if (local_58 != T_STOP) {
      TVar6 = T_STOP;
      do {
        uVar3 = skip<duckdb_apache::thrift::protocol::TCompactProtocolT<duckdb::ThriftFileTransport>>
                          (prot,local_50._0_4_);
        uVar2 = uVar2 + uVar3;
        TVar6 = TVar6 + T_VOID;
      } while (TVar6 < local_58);
    }
    break;
  case T_LIST:
    uVar2 = TCompactProtocolT<duckdb::ThriftFileTransport>::readListBegin
                      (prot,(TType *)local_50,&local_58);
    if (local_58 != T_STOP) {
      TVar6 = T_STOP;
      do {
        uVar3 = skip<duckdb_apache::thrift::protocol::TCompactProtocolT<duckdb::ThriftFileTransport>>
                          (prot,local_50._0_4_);
        uVar2 = uVar2 + uVar3;
        TVar6 = TVar6 + T_VOID;
      } while (TVar6 < local_58);
    }
  }
  puVar1 = &(prot->
            super_TVirtualProtocol<duckdb_apache::thrift::protocol::TCompactProtocolT<duckdb::ThriftFileTransport>,_duckdb_apache::thrift::protocol::TProtocolDefaults>
            ).super_TProtocolDefaults.super_TProtocol.input_recursion_depth_;
  *puVar1 = *puVar1 - 1;
  return uVar2;
}

Assistant:

uint32_t skip(Protocol_& prot, TType type) {
  TInputRecursionTracker tracker(prot);

  switch (type) {
  case T_BOOL: {
    bool boolv;
    return prot.readBool(boolv);
  }
  case T_BYTE: {
    int8_t bytev = 0;
    return prot.readByte(bytev);
  }
  case T_I16: {
    int16_t i16;
    return prot.readI16(i16);
  }
  case T_I32: {
    int32_t i32;
    return prot.readI32(i32);
  }
  case T_I64: {
    int64_t i64;
    return prot.readI64(i64);
  }
  case T_DOUBLE: {
    double dub;
    return prot.readDouble(dub);
  }
  case T_STRING: {
    std::string str;
    return prot.readBinary(str);
  }
  case T_STRUCT: {
    uint32_t result = 0;
    std::string name;
    int16_t fid;
    TType ftype;
    result += prot.readStructBegin(name);
    while (true) {
      result += prot.readFieldBegin(name, ftype, fid);
      if (ftype == T_STOP) {
        break;
      }
      result += skip(prot, ftype);
      result += prot.readFieldEnd();
    }
    result += prot.readStructEnd();
    return result;
  }
  case T_MAP: {
    uint32_t result = 0;
    TType keyType;
    TType valType;
    uint32_t i, size;
    result += prot.readMapBegin(keyType, valType, size);
    for (i = 0; i < size; i++) {
      result += skip(prot, keyType);
      result += skip(prot, valType);
    }
    result += prot.readMapEnd();
    return result;
  }
  case T_SET: {
    uint32_t result = 0;
    TType elemType;
    uint32_t i, size;
    result += prot.readSetBegin(elemType, size);
    for (i = 0; i < size; i++) {
      result += skip(prot, elemType);
    }
    result += prot.readSetEnd();
    return result;
  }
  case T_LIST: {
    uint32_t result = 0;
    TType elemType;
    uint32_t i, size;
    result += prot.readListBegin(elemType, size);
    for (i = 0; i < size; i++) {
      result += skip(prot, elemType);
    }
    result += prot.readListEnd();
    return result;
  }
  default:
    break;
  }

  throw TProtocolException(TProtocolException::INVALID_DATA,
                           "invalid TType");
}